

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

UEnumeration * ucurr_openISOCurrencies_63(uint32_t currType,UErrorCode *pErrorCode)

{
  UEnumeration *buffer;
  uint32_t *puVar1;
  
  buffer = (UEnumeration *)uprv_malloc_63(0x38);
  if (buffer == (UEnumeration *)0x0) {
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
  }
  else {
    buffer->reset = ucurr_resetCurrencyList;
    buffer->uNext = uenum_unextDefault_63;
    buffer->next = ucurr_nextCurrencyList;
    buffer->close = ucurr_closeCurrencyList;
    buffer->count = ucurr_countCurrencyList;
    buffer->baseContext = (void *)0x0;
    buffer->context = (void *)0x0;
    puVar1 = (uint32_t *)uprv_malloc_63(8);
    if (puVar1 != (uint32_t *)0x0) {
      *puVar1 = currType;
      puVar1[1] = 0;
      buffer->context = puVar1;
      return buffer;
    }
    *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
    uprv_free_63(buffer);
  }
  return (UEnumeration *)0x0;
}

Assistant:

U_CAPI UEnumeration * U_EXPORT2
ucurr_openISOCurrencies(uint32_t currType, UErrorCode *pErrorCode) {
    UEnumeration *myEnum = NULL;
    UCurrencyContext *myContext;

    myEnum = (UEnumeration*)uprv_malloc(sizeof(UEnumeration));
    if (myEnum == NULL) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        return NULL;
    }
    uprv_memcpy(myEnum, &gEnumCurrencyList, sizeof(UEnumeration));
    myContext = (UCurrencyContext*)uprv_malloc(sizeof(UCurrencyContext));
    if (myContext == NULL) {
        *pErrorCode = U_MEMORY_ALLOCATION_ERROR;
        uprv_free(myEnum);
        return NULL;
    }
    myContext->currType = currType;
    myContext->listIdx = 0;
    myEnum->context = myContext;
    return myEnum;
}